

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

Pdr_Set_t * Pdr_SetCreateSubset(Pdr_Set_t *pSet,int *pLits,int nLits)

{
  Pdr_Set_t *pPVar1;
  int local_30;
  int local_2c;
  int k;
  int i;
  Pdr_Set_t *p;
  int nLits_local;
  int *pLits_local;
  Pdr_Set_t *pSet_local;
  
  local_30 = 0;
  if ((nLits < 0) || (pSet->nLits < nLits)) {
    __assert_fail("nLits >= 0 && nLits <= pSet->nLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                  ,0x88,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
  }
  pPVar1 = (Pdr_Set_t *)malloc((long)((nLits + pSet->nTotal) - pSet->nLits) * 4 + 0x18);
  pPVar1->nLits = nLits;
  pPVar1->nTotal = (nLits + pSet->nTotal) - pSet->nLits;
  pPVar1->nRefs = 1;
  pPVar1->Sign = 0;
  for (local_2c = 0; local_2c < nLits; local_2c = local_2c + 1) {
    if (pLits[local_2c] < 0) {
      __assert_fail("pLits[i] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                    ,0x90,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
    }
    *(int *)(&pPVar1->field_0x14 + (long)local_30 * 4) = pLits[local_2c];
    pPVar1->Sign = 1L << ((byte)((long)pLits[local_2c] % 0x3f) & 0x3f) | pPVar1->Sign;
    local_30 = local_30 + 1;
  }
  Vec_IntSelectSort((int *)&pPVar1->field_0x14,pPVar1->nLits);
  for (local_2c = pSet->nLits; local_2c < pSet->nTotal; local_2c = local_2c + 1) {
    *(undefined4 *)(&pPVar1->field_0x14 + (long)local_30 * 4) =
         *(undefined4 *)(&pSet->field_0x14 + (long)local_2c * 4);
    local_30 = local_30 + 1;
  }
  if (local_30 == pPVar1->nTotal) {
    return pPVar1;
  }
  __assert_fail("k == p->nTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                ,0x97,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
}

Assistant:

Pdr_Set_t * Pdr_SetCreateSubset( Pdr_Set_t * pSet, int * pLits, int nLits )
{
    Pdr_Set_t * p;
    int i, k = 0;
    assert( nLits >= 0 && nLits <= pSet->nLits );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (nLits + pSet->nTotal - pSet->nLits) * sizeof(int) );
    p->nLits  = nLits;
    p->nTotal = nLits + pSet->nTotal - pSet->nLits;
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < nLits; i++ )
    {
        assert( pLits[i] >= 0 );
        p->Lits[k++] = pLits[i];
        p->Sign   |= ((word)1 << (pLits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    for ( i = pSet->nLits; i < pSet->nTotal; i++ )
        p->Lits[k++] = pSet->Lits[i];
    assert( k == p->nTotal );
    return p;
}